

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O2

Result_Type __thiscall
chaiscript::detail::Dispatch_Engine::
boxed_cast<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>
          (Dispatch_Engine *this,Boxed_Value *bv)

{
  Boxed_Value *in_RDX;
  Result_Type RVar1;
  Type_Conversions_State state;
  Type_Conversions_State local_28;
  
  local_28.m_saves._M_data =
       threading::Thread_Storage<chaiscript::Type_Conversions::Conversion_Saves>::operator*
                 ((Thread_Storage<chaiscript::Type_Conversions::Conversion_Saves> *)(bv + 0xc));
  local_28.m_conversions._M_data =
       (Type_Conversions *)
       &bv[2].m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount;
  RVar1 = chaiscript::boxed_cast<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>
                    ((chaiscript *)this,in_RDX,&local_28);
  RVar1.
  super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (Result_Type)
         RVar1.
         super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

typename detail::Cast_Helper<Type>::Result_Type boxed_cast(const Boxed_Value &bv) const
          {
            Type_Conversions_State state(m_conversions, m_conversions.conversion_saves());
            return chaiscript::boxed_cast<Type>(bv, &state);
          }